

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_persistence_from_file.h
# Opt level: O3

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,string *filename,int dimension,
          double what_to_substitute_for_infinite_bar)

{
  pointer *pppVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  iterator iVar5;
  long lVar6;
  long lVar7;
  function_output_iterator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_common_include_gudhi_reader_utils_h:359:54)>
  out;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> barcode_initial;
  string line;
  pair<double,_double> local_78;
  void *local_68;
  void *pvStack_60;
  long local_58;
  double local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_40 = 0;
  local_38 = 0;
  local_58 = 0;
  local_68 = (void *)0x0;
  pvStack_60 = (void *)0x0;
  out.m_f.ret = (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                0x0;
  out.m_f._0_8_ = &local_68;
  local_50 = what_to_substitute_for_infinite_bar;
  local_48 = &local_38;
  read_persistence_intervals_and_dimension<boost::iterators::function_output_iterator<Gudhi::read_persistence_intervals_in_dimension(std::__cxx11::string_const&,int)::_lambda(std::tuple<int,double,double>)_1_>>
            ((Gudhi *)filename,(string *)(ulong)(uint)dimension,out);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::reserve
            (__return_storage_ptr__,(long)pvStack_60 - (long)local_68 >> 4);
  if (pvStack_60 != local_68) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      dVar2 = *(double *)((long)local_68 + lVar6);
      dVar3 = *(double *)((long)local_68 + lVar6 + 8);
      if (dVar2 <= dVar3) {
        if (INFINITY <= dVar3) {
          bVar4 = true;
        }
        else {
          local_78.second = *(double *)((long)local_68 + lVar6 + 8);
          iVar5._M_current =
               (__return_storage_ptr__->
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_78.first = dVar2;
          if (iVar5._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
            _M_realloc_insert<std::pair<double,double>>
                      ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                       __return_storage_ptr__,iVar5,&local_78);
          }
          else {
            (iVar5._M_current)->first = dVar2;
            (iVar5._M_current)->second = local_78.second;
            pppVar1 = &(__return_storage_ptr__->
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          bVar4 = INFINITY <= *(double *)((long)local_68 + lVar6 + 8);
        }
        if ((((local_50 != -1.0) || (NAN(local_50))) && (bVar4)) &&
           (dVar2 = *(double *)((long)local_68 + lVar6), dVar2 < local_50)) {
          local_78.second = local_50;
          iVar5._M_current =
               (__return_storage_ptr__->
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_78.first = dVar2;
          if (iVar5._M_current !=
              (__return_storage_ptr__->
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00102520;
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     __return_storage_ptr__,iVar5,&local_78);
        }
      }
      else {
        local_78.second = *(double *)((long)local_68 + lVar6);
        iVar5._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_78.first = dVar3;
        if (iVar5._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     __return_storage_ptr__,iVar5,&local_78);
        }
        else {
LAB_00102520:
          (iVar5._M_current)->first = local_78.first;
          (iVar5._M_current)->second = local_78.second;
          pppVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 != (long)pvStack_60 - (long)local_68 >> 4);
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double> > read_persistence_intervals_in_one_dimension_from_file(
    std::string const& filename, int dimension = -1, double what_to_substitute_for_infinite_bar = -1) {
  bool dbg = false;

  std::string line;
  std::vector<std::pair<double, double> > barcode_initial =
      read_persistence_intervals_in_dimension(filename, static_cast<int>(dimension));
  std::vector<std::pair<double, double> > final_barcode;
  final_barcode.reserve(barcode_initial.size());

  if (dbg) {
    std::clog << "Here are the intervals that we read from the file : \n";
    for (size_t i = 0; i != barcode_initial.size(); ++i) {
      std::clog << barcode_initial[i].first << " " << barcode_initial[i].second << std::endl;
    }
    getchar();
  }

  for (size_t i = 0; i != barcode_initial.size(); ++i) {
    if (dbg) {
      std::clog << "Considering interval : " << barcode_initial[i].first << " " << barcode_initial[i].second
                << std::endl;
    }

    if (barcode_initial[i].first > barcode_initial[i].second) {
      // note that in this case barcode_initial[i].second != std::numeric_limits<double>::infinity()
      if (dbg) std::clog << "Swap and enter \n";
      // swap them to make sure that birth < death
      final_barcode.push_back(std::pair<double, double>(barcode_initial[i].second, barcode_initial[i].first));
      continue;
    } else {
      if (barcode_initial[i].second != std::numeric_limits<double>::infinity()) {
        if (dbg) std::clog << "Simply enters\n";
        // in this case, due to the previous conditions we know that barcode_initial[i].first <
        // barcode_initial[i].second, so we put them as they are
        final_barcode.push_back(std::pair<double, double>(barcode_initial[i].first, barcode_initial[i].second));
      }
    }

    if ((barcode_initial[i].second == std::numeric_limits<double>::infinity()) &&
        (what_to_substitute_for_infinite_bar != -1)) {
      if (barcode_initial[i].first < what_to_substitute_for_infinite_bar) {
        // if only birth < death.
        final_barcode.push_back(
            std::pair<double, double>(barcode_initial[i].first, what_to_substitute_for_infinite_bar));
      }
    } else {
      // if the variable what_to_substitute_for_infinite_bar is not set, then we ignore all the infinite bars.
    }
  }

  if (dbg) {
    std::clog << "Here are the final bars that we are sending further : \n";
    for (size_t i = 0; i != final_barcode.size(); ++i) {
      std::clog << final_barcode[i].first << " " << final_barcode[i].second << std::endl;
    }
    std::clog << "final_barcode.size() : " << final_barcode.size() << std::endl;
    getchar();
  }

  return final_barcode;
}